

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserClass.cc
# Opt level: O0

void __thiscall ParserClass::readInput(ParserClass *this)

{
  bool bVar1;
  char *pcVar2;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [36];
  int local_84;
  string local_80 [4];
  int theNum;
  byte local_5d;
  bool flag;
  string local_50 [8];
  string nextLine;
  string local_30 [8];
  string line;
  ParserClass *this_local;
  
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_30);
  local_5d = 0;
LAB_00104d7c:
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            if ((local_5d & 1) != 0) {
              std::__cxx11::string::~string(local_50);
              std::__cxx11::string::~string(local_30);
              return;
            }
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&std::cin,local_30);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_30,SELECT_VAR);
            if (!bVar1) break;
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&std::cin,local_50);
            std::__cxx11::string::string(local_80,local_50);
            setSelectVar(this,(string *)local_80);
            std::__cxx11::string::~string(local_80);
          }
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30,NUM_OF_GROUPING);
          if (!bVar1) break;
          std::istream::operator>>((istream *)&std::cin,&local_84);
          (this->inputs).num = local_84;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&std::cin,local_30);
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,GROUPING_ATTRIBUTE);
        if (!bVar1) break;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,local_50);
        std::__cxx11::string::operator=((string *)&(this->inputs).group_var,local_50);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,AGG_FUNCS);
      if (!bVar1) break;
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_50);
      std::__cxx11::string::string(local_a8,local_50);
      setAggFunc(this,(string *)local_a8);
      std::__cxx11::string::~string(local_a8);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,SELECT_CONDS);
  } while (!bVar1);
  do {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,HAVING_CONDS);
    if (bVar1) {
      std::__cxx11::string::string(local_c8,local_50);
      setSelectCond(this,(string *)local_c8);
      std::__cxx11::string::~string(local_c8);
    }
    else {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_50);
      pcVar2 = (char *)std::__cxx11::string::back();
      if (*pcVar2 == ';') {
        std::__cxx11::string::pop_back();
        local_5d = 1;
      }
      std::__cxx11::string::string(local_e8,local_50);
      setHavingCond(this,(string *)local_e8);
      std::__cxx11::string::~string(local_e8);
      if ((local_5d & 1) != 0) goto LAB_00104d7c;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_50);
  } while( true );
}

Assistant:

void ParserClass::readInput()
{
    std::string line;
    std::string nextLine;
    getline(std::cin, line);
    bool flag = false;
    while(true)
    {
        if (flag)
            break;
        getline(std::cin, line);
        if (line == ParserClass::SELECT_VAR)
        {
            getline(std::cin, nextLine);
            this->setSelectVar(nextLine);
        }
        else if (line == ParserClass::NUM_OF_GROUPING)
        {
            int theNum;
            std::cin >> theNum;
            this->inputs.num = theNum;
            getline(std::cin, line);
        }
        else if (line == ParserClass::GROUPING_ATTRIBUTE)
        {
            getline(std::cin, nextLine);
            this->inputs.group_var = nextLine;
        }
        else if (line == ParserClass::AGG_FUNCS)
        {
            getline(std::cin, nextLine);
            this->setAggFunc(nextLine);
        }
        else if (line == ParserClass::SELECT_CONDS)
        {
            /*
             * The number of lines in SELECT CONDITION-VECT([σ]) is unknown.
             * So we parse SELECT COND and HAVING COND together. 
             */
            do
            {
                if (nextLine != ParserClass::HAVING_CONDS)
                    this->setSelectCond(nextLine);
                else
                {
                    getline(std::cin, nextLine);
                    if (nextLine.back() == ';')
                    {
                        nextLine.pop_back();
                        flag = true;
                    }
                    this->setHavingCond(nextLine);
                    if (flag)
                        break;
                }
                getline(std::cin, nextLine);
            } while (true);
        }
    }
}